

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_declare_param
          (irGenerator *this,string *name,SymbolKind kind,int id)

{
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  PtrTy *this_00;
  IntTy *pIVar2;
  iterator iVar3;
  SharedTyPtr ty;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_38;
  
  ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ir_declare_value(this,&local_38,kind,id,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,Var,0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (kind == INT) {
    pIVar2 = (IntTy *)operator_new(8);
    (pIVar2->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_78,pIVar2);
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,&local_78);
    p_Var1 = &local_78;
  }
  else {
    if (kind != Ptr) goto LAB_0016c763;
    this_00 = (PtrTy *)operator_new(0x18);
    pIVar2 = (IntTy *)operator_new(8);
    (pIVar2->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_68,pIVar2);
    mir::types::PtrTy::PtrTy(this_00,(SharedTyPtr *)&local_68);
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::PtrTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_78,this_00);
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    p_Var1 = &local_68;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
LAB_0016c763:
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::find(&(this->_package).functions._M_t,
                 (this->_funcStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  push_back((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
             *)&(iVar3._M_node[3]._M_parent)->_M_right,&ty);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void irGenerator::ir_declare_param(string name, symbol::SymbolKind kind,
                                   int id) {
  SharedTyPtr ty;

  ir_declare_value(name, kind, id, {});

  switch (kind) {
    case front::symbol::SymbolKind::INT: {
      ty = SharedTyPtr(new IntTy());
      break;
    }
    case front::symbol::SymbolKind::Ptr: {
      ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
      break;
    }
    default:
      break;
  }
  _package.functions.find(_funcStack.back())->second.type->params.push_back(ty);
}